

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStateReset.cpp
# Opt level: O2

void glu::resetState(RenderContext *renderCtx,ContextInfo *ctxInfo)

{
  uint uVar1;
  InternalError *this;
  allocator<char> local_39;
  string local_38;
  
  uVar1 = (*renderCtx->_vptr_RenderContext[2])();
  if ((uVar1 & 0x300) == 0) {
    resetStateES(renderCtx,ctxInfo);
    return;
  }
  uVar1 = (*renderCtx->_vptr_RenderContext[2])(renderCtx);
  if ((uVar1 & 0x300) == 0x100) {
    resetStateGLCore(renderCtx,ctxInfo);
    return;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"State reset requested for unsupported context type",&local_39);
  tcu::InternalError::InternalError(this,&local_38);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void resetState (const RenderContext& renderCtx, const ContextInfo& ctxInfo)
{
	if (isContextTypeES(renderCtx.getType()))
		resetStateES(renderCtx, ctxInfo);
	else if (isContextTypeGLCore(renderCtx.getType()))
		resetStateGLCore(renderCtx, ctxInfo);
	else
		throw tcu::InternalError("State reset requested for unsupported context type");
}